

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_duckdb::Value_&,_const_unsigned_long_&> * __thiscall
Catch::ExprLhs<duckdb::Value_const&>::operator==
          (ExprLhs<const_duckdb::Value_&> *this,unsigned_long *rhs)

{
  StringRef op;
  bool comparisonResult;
  Value *in_RSI;
  BinaryExpr<const_duckdb::Value_&,_const_unsigned_long_&> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_duckdb::Value_&,_const_unsigned_long_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult = compareEqual<duckdb::Value,unsigned_long>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)in_RSI;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_duckdb::Value_&,_const_unsigned_long_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }